

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void d68000_scc(m68k_info *info)

{
  MCInst_setOpcode(info->inst,*(uint *)((long)s_scc_lut + (ulong)(info->ir >> 6 & 0x3c)));
  (info->extension).op_count = '\x01';
  (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
  (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x1;
  get_ea_mode_op(info,(info->extension).operands,info->ir,1);
  return;
}

Assistant:

static void d68000_scc(m68k_info *info)
{
	cs_m68k* ext = build_init_op(info, s_scc_lut[(info->ir >> 8) & 0xf], 1, 1);
	get_ea_mode_op(info, &ext->operands[0], info->ir, 1);
}